

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

word Abc_Tt6Expand(word t,int *pCut0,int nCutSize0,int *pCut,int nCutSize)

{
  int local_34;
  int local_30;
  int k;
  int i;
  int nCutSize_local;
  int *pCut_local;
  int nCutSize0_local;
  int *pCut0_local;
  word t_local;
  
  local_30 = nCutSize + -1;
  local_34 = nCutSize0 + -1;
  pCut0_local = (int *)t;
  do {
    if (local_30 < 0 || local_34 < 0) {
      if (local_34 == -1) {
        return (word)pCut0_local;
      }
      __assert_fail("k == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x732,"word Abc_Tt6Expand(word, int *, int, int *, int)");
    }
    if (pCut[local_30] <= pCut0[local_34]) {
      if (pCut[local_30] != pCut0[local_34]) {
        __assert_fail("pCut[i] == pCut0[k]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x72d,"word Abc_Tt6Expand(word, int *, int, int *, int)");
      }
      if (local_34 < local_30) {
        pCut0_local = (int *)Abc_Tt6SwapVars((word)pCut0_local,local_34,local_30);
      }
      local_34 = local_34 + -1;
    }
    local_30 = local_30 + -1;
  } while( true );
}

Assistant:

static inline word Abc_Tt6Expand( word t, int * pCut0, int nCutSize0, int * pCut, int nCutSize )
{
    int i, k;
    for ( i = nCutSize - 1, k = nCutSize0 - 1; i >= 0 && k >= 0; i-- )
    {
        if ( pCut[i] > pCut0[k] )
            continue;
        assert( pCut[i] == pCut0[k] );
        if ( k < i )
            t = Abc_Tt6SwapVars( t, k, i );
        k--;
    }
    assert( k == -1 );
    return t;
}